

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall
icu_63::VTimeZone::beginZoneProps
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,UDate startTime,UErrorCode *status)

{
  UnicodeString *__n;
  undefined3 in_register_00000011;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  undefined4 extraout_EDX_03;
  undefined4 extraout_EDX_04;
  undefined4 extraout_EDX_05;
  undefined4 extraout_EDX_06;
  undefined4 extraout_EDX_07;
  undefined4 extraout_EDX_08;
  undefined4 extraout_EDX_09;
  undefined4 extraout_EDX_10;
  undefined4 extraout_EDX_11;
  undefined4 extraout_EDX_12;
  undefined4 extraout_EDX_13;
  undefined4 extraout_EDX_14;
  undefined4 extraout_EDX_15;
  undefined4 extraout_EDX_16;
  undefined4 extraout_EDX_17;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  int __fd;
  UnicodeString dstr;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    __n = zonename;
    VTZWriter::write(writer,0x2d9f90,
                     (void *)CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,isDst)),
                     (size_t)zonename);
    VTZWriter::write(writer,0x3a,(void *)CONCAT44(extraout_var,extraout_EDX),(size_t)__n);
    __fd = 0x2d9ff0;
    if (isDst == '\0') {
      __fd = 0x2da010;
    }
    VTZWriter::write(writer,__fd,(void *)CONCAT44(extraout_var_00,extraout_EDX_00),(size_t)__n);
    VTZWriter::write(writer,0x2da09e,(void *)CONCAT44(extraout_var_01,extraout_EDX_01),(size_t)__n);
    dstr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
    dstr.fUnion.fStackFields.fLengthAndFlags = 2;
    VTZWriter::write(writer,0x2da070,(void *)CONCAT44(extraout_var_02,extraout_EDX_02),(size_t)__n);
    VTZWriter::write(writer,0x3a,(void *)CONCAT44(extraout_var_03,extraout_EDX_03),(size_t)__n);
    millisToOffset(toOffset,&dstr);
    VTZWriter::write(writer,(int)&dstr,(void *)CONCAT44(extraout_var_04,extraout_EDX_04),(size_t)__n
                    );
    VTZWriter::write(writer,0x2da09e,(void *)CONCAT44(extraout_var_05,extraout_EDX_05),(size_t)__n);
    VTZWriter::write(writer,0x2da050,(void *)CONCAT44(extraout_var_06,extraout_EDX_06),(size_t)__n);
    VTZWriter::write(writer,0x3a,(void *)CONCAT44(extraout_var_07,extraout_EDX_07),(size_t)__n);
    millisToOffset(fromOffset,&dstr);
    VTZWriter::write(writer,(int)&dstr,(void *)CONCAT44(extraout_var_08,extraout_EDX_08),(size_t)__n
                    );
    VTZWriter::write(writer,0x2da09e,(void *)CONCAT44(extraout_var_09,extraout_EDX_09),(size_t)__n);
    VTZWriter::write(writer,0x2da040,(void *)CONCAT44(extraout_var_10,extraout_EDX_10),(size_t)__n);
    VTZWriter::write(writer,0x3a,(void *)CONCAT44(extraout_var_11,extraout_EDX_11),(size_t)__n);
    VTZWriter::write(writer,(int)zonename,(void *)CONCAT44(extraout_var_12,extraout_EDX_12),
                     (size_t)__n);
    VTZWriter::write(writer,0x2da09e,(void *)CONCAT44(extraout_var_13,extraout_EDX_13),(size_t)__n);
    VTZWriter::write(writer,0x2da030,(void *)CONCAT44(extraout_var_14,extraout_EDX_14),(size_t)__n);
    VTZWriter::write(writer,0x3a,(void *)CONCAT44(extraout_var_15,extraout_EDX_15),(size_t)__n);
    getDateTimeString((double)fromOffset + startTime,&dstr);
    VTZWriter::write(writer,(int)&dstr,(void *)CONCAT44(extraout_var_16,extraout_EDX_16),(size_t)__n
                    );
    VTZWriter::write(writer,0x2da09e,(void *)CONCAT44(extraout_var_17,extraout_EDX_17),(size_t)__n);
    UnicodeString::~UnicodeString(&dstr);
  }
  return;
}

Assistant:

void
VTimeZone::beginZoneProps(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                          int32_t fromOffset, int32_t toOffset, UDate startTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BEGIN);
    writer.write(COLON);
    if (isDst) {
        writer.write(ICAL_DAYLIGHT);
    } else {
        writer.write(ICAL_STANDARD);
    }
    writer.write(ICAL_NEWLINE);

    UnicodeString dstr;

    // TZOFFSETTO
    writer.write(ICAL_TZOFFSETTO);
    writer.write(COLON);
    millisToOffset(toOffset, dstr);
    writer.write(dstr);
    writer.write(ICAL_NEWLINE);

    // TZOFFSETFROM
    writer.write(ICAL_TZOFFSETFROM);
    writer.write(COLON);
    millisToOffset(fromOffset, dstr);
    writer.write(dstr);
    writer.write(ICAL_NEWLINE);

    // TZNAME
    writer.write(ICAL_TZNAME);
    writer.write(COLON);
    writer.write(zonename);
    writer.write(ICAL_NEWLINE);
    
    // DTSTART
    writer.write(ICAL_DTSTART);
    writer.write(COLON);
    writer.write(getDateTimeString(startTime + fromOffset, dstr));
    writer.write(ICAL_NEWLINE);        
}